

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O0

void __thiscall
KeyboardConfigTab::KeyboardConfigTab
          (KeyboardConfigTab *this,PianoInput *input,ShortcutTable *shortcuts,QWidget *parent)

{
  QVBoxLayout *pQVar1;
  QHBoxLayout *pQVar2;
  QLabel *pQVar3;
  QComboBox *pQVar4;
  QGroupBox *pQVar5;
  BindingEdit *pBVar6;
  QTreeView *pQVar7;
  ShortcutTableModel *this_00;
  QKeySequenceEdit *pQVar8;
  QPushButton *pQVar9;
  Bindings *bindings;
  offset_in_QItemSelectionModel_to_subr signal;
  QObject *context;
  anon_class_8_1_8991fb9c_for_function slot;
  ConnectionType type;
  Object local_298 [8];
  code *local_290;
  undefined8 uStack_288;
  code *local_280;
  undefined8 local_278;
  Object local_270 [8];
  code *local_268;
  undefined8 local_260;
  KeyboardConfigTab *local_258;
  Object local_250 [8];
  code *local_248;
  undefined8 local_240;
  KeyboardConfigTab *local_238;
  Object local_230 [8];
  code *local_228;
  undefined8 local_220;
  KeyboardConfigTab *local_218;
  Object local_210 [8];
  code *local_208;
  undefined8 uStack_200;
  code *local_1f8;
  undefined8 local_1f0;
  Object local_1e8 [8];
  code *local_1e0;
  undefined8 uStack_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [40];
  QString local_198;
  KeyboardLayout local_180;
  QFlags<Qt::AlignmentFlag> local_17c;
  int kblayout;
  QFlags<Qt::AlignmentFlag> local_174;
  QFlags<Qt::AlignmentFlag> local_170;
  QFlags<Qt::AlignmentFlag> local_16c;
  QFlags<Qt::AlignmentFlag> local_168;
  QFlags<Qt::AlignmentFlag> local_164;
  undefined1 local_15d;
  QFlags<Qt::WindowType> local_15c;
  QString local_158;
  undefined1 local_139;
  QString local_138;
  undefined1 local_119;
  QString local_118;
  QHBoxLayout *local_100;
  QHBoxLayout *shortcutEditLayout;
  QTreeView *shortcutView;
  QVBoxLayout *shortcutLayout;
  QString local_e0;
  QGroupBox *local_c8;
  QGroupBox *shortcutGroup;
  undefined1 local_b5;
  QFlags<Qt::WindowType> local_b4;
  QString local_b0;
  QVBoxLayout *local_98;
  QVBoxLayout *customLayout;
  QString local_88;
  QFlags<Qt::AlignmentFlag> local_70;
  QFlags<Qt::AlignmentFlag> local_6c;
  undefined1 local_65;
  QFlags<Qt::WindowType> local_64;
  QString local_60;
  QHBoxLayout *local_48;
  QHBoxLayout *keyboardLayoutLayout;
  QVBoxLayout *local_30;
  QVBoxLayout *layout;
  QWidget *parent_local;
  ShortcutTable *shortcuts_local;
  PianoInput *input_local;
  KeyboardConfigTab *this_local;
  
  layout = (QVBoxLayout *)parent;
  parent_local = (QWidget *)shortcuts;
  shortcuts_local = (ShortcutTable *)input;
  input_local = (PianoInput *)this;
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_002d3dd8;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__KeyboardConfigTab_002d3f88;
  this->mInput = (PianoInput *)shortcuts_local;
  this->mShortcuts = (ShortcutTable *)parent_local;
  this->mSelectedShortcut = -1;
  pQVar1 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar1);
  local_30 = pQVar1;
  pQVar2 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar2);
  local_48 = pQVar2;
  pQVar3 = (QLabel *)operator_new(0x28);
  local_65 = 1;
  tr(&local_60,"Layout:",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_64);
  QLabel::QLabel(pQVar3,(QString *)&local_60,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_64.i);
  local_65 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_6c);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar3,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_60);
  pQVar4 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar4,(QWidget *)0x0);
  pQVar2 = local_48;
  this->mLayoutCombo = pQVar4;
  pQVar4 = this->mLayoutCombo;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_70);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar4,(QFlags_conflict1 *)0x1);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  customLayout._7_1_ = 1;
  tr(&local_88,"Custom layout",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_88,(QWidget *)0x0);
  customLayout._7_1_ = 0;
  this->mCustomGroup = pQVar5;
  QString::~QString(&local_88);
  pQVar1 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar1);
  local_98 = pQVar1;
  pQVar3 = (QLabel *)operator_new(0x28);
  local_b5 = 1;
  tr(&local_b0,"Assign keys to each note. Press Shift+Del to unbind.",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_b4);
  QLabel::QLabel(pQVar3,(QString *)&local_b0,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_b4.i);
  local_b5 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&shortcutGroup + 4));
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar3,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_b0);
  pBVar6 = (BindingEdit *)operator_new(0x100);
  BindingEdit::BindingEdit(pBVar6,(QWidget *)0x0);
  pQVar1 = local_98;
  this->mBindingEdit = pBVar6;
  pBVar6 = this->mBindingEdit;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&shortcutGroup);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pBVar6,(QFlags_conflict1 *)0x0);
  QWidget::setLayout((QLayout *)this->mCustomGroup);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  shortcutLayout._7_1_ = 1;
  tr(&local_e0,"Shortcuts",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_e0,(QWidget *)0x0);
  shortcutLayout._7_1_ = 0;
  QString::~QString(&local_e0);
  local_c8 = pQVar5;
  pQVar1 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar1);
  shortcutView = (QTreeView *)pQVar1;
  pQVar7 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(pQVar7,(QWidget *)0x0);
  shortcutEditLayout = (QHBoxLayout *)pQVar7;
  this_00 = (ShortcutTableModel *)operator_new(0x18);
  ShortcutTableModel::ShortcutTableModel(this_00,(ShortcutTable *)parent_local,(QObject *)this);
  this->mModel = this_00;
  (**(code **)(*(long *)shortcutEditLayout + 0x1c8))(shortcutEditLayout,this->mModel);
  pQVar2 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar2);
  local_100 = pQVar2;
  pQVar8 = (QKeySequenceEdit *)operator_new(0x28);
  QKeySequenceEdit::QKeySequenceEdit(pQVar8,(QWidget *)0x0);
  this->mKeyEdit = pQVar8;
  pQVar9 = (QPushButton *)operator_new(0x28);
  local_119 = Key_Escape >> 0x18;
  tr(&local_118,"Clear",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar9,(QString *)&local_118,(QWidget *)0x0);
  local_119 = 0;
  this->mClearButton = pQVar9;
  QString::~QString(&local_118);
  pQVar9 = (QPushButton *)operator_new(0x28);
  local_139 = Key_Escape >> 0x18;
  tr(&local_138,"Default",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar9,(QString *)&local_138,(QWidget *)0x0);
  local_139 = 0;
  this->mDefaultButton = pQVar9;
  QString::~QString(&local_138);
  pQVar2 = local_100;
  pQVar3 = (QLabel *)operator_new(0x28);
  local_15d = Key_Escape >> 0x18;
  tr(&local_158,"Keys:",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_15c);
  QLabel::QLabel(pQVar3,(QString *)&local_158,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_15c.i)
  ;
  local_15d = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_164);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar3,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_158);
  pQVar2 = local_100;
  pQVar8 = this->mKeyEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_168);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar8,(QFlags_conflict1 *)0x1);
  pQVar2 = local_100;
  pQVar9 = this->mClearButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_16c);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar9,(QFlags_conflict1 *)0x0);
  pQVar2 = local_100;
  pQVar9 = this->mDefaultButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_170);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar9,(QFlags_conflict1 *)0x0);
  pQVar7 = shortcutView;
  pQVar2 = shortcutEditLayout;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_174);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar2,(QFlags_conflict1 *)0x1);
  QBoxLayout::addLayout((QLayout *)shortcutView,(int)local_100);
  QWidget::setLayout((QLayout *)local_c8);
  QBoxLayout::addLayout((QLayout *)local_30,(int)local_48);
  pQVar1 = local_30;
  pQVar5 = this->mCustomGroup;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&kblayout);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar5,(QFlags_conflict1 *)0x0);
  pQVar1 = local_30;
  pQVar5 = local_c8;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_17c);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar5,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)local_30);
  QWidget::setLayout((QLayout *)this);
  QTreeView::resizeColumnToContents((int)shortcutEditLayout);
  for (local_180 = LayoutQwerty; (int)local_180 < 4; local_180 = local_180 + LayoutQwertz) {
    pQVar4 = this->mLayoutCombo;
    PianoInput::layoutName(&local_198,local_180);
    QVariant::QVariant((QVariant *)(local_1c0 + 8));
    QComboBox::addItem(pQVar4,&local_198,(QVariant *)(local_1c0 + 8));
    QVariant::~QVariant((QVariant *)(local_1c0 + 8));
    QString::~QString(&local_198);
  }
  pQVar4 = this->mLayoutCombo;
  PianoInput::layout((PianoInput *)shortcuts_local);
  QComboBox::setCurrentIndex((int)pQVar4);
  pQVar5 = this->mCustomGroup;
  PianoInput::layout((PianoInput *)shortcuts_local);
  QWidget::setEnabled(SUB81(pQVar5,0));
  pBVar6 = this->mBindingEdit;
  bindings = PianoInput::bindings((PianoInput *)shortcuts_local);
  BindingEdit::setBindings(pBVar6,bindings);
  local_1d0 = BindingEdit::bindingsChanged;
  local_1c8 = 0;
  local_1e0 = ConfigTab::setDirty<(Config::Category)4>;
  uStack_1d8 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(BindingEdit::*)(),void(ConfigTab::*)()>
            ((Object *)local_1c0,(_t)this->mBindingEdit,(Object *)BindingEdit::bindingsChanged,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_1c0);
  local_1f8 = QAbstractButton::clicked;
  local_1f0 = 0;
  local_208 = QKeySequenceEdit::clear;
  uStack_200 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QKeySequenceEdit::*)()>
            (local_1e8,(offset_in_QAbstractButton_to_subr)this->mClearButton,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->mKeyEdit);
  QMetaObject::Connection::~Connection((Connection *)local_1e8);
  local_228 = QAbstractButton::clicked;
  local_220 = 0;
  local_218 = this;
  QObject::
  connect<void(QAbstractButton::*)(bool),KeyboardConfigTab::KeyboardConfigTab(PianoInput&,ShortcutTable&,QWidget*)::__0>
            (local_210,(offset_in_QAbstractButton_to_subr)this->mDefaultButton,
             (QObject *)QAbstractButton::clicked,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_210);
  signal = QAbstractItemView::selectionModel();
  local_248 = QItemSelectionModel::selectionChanged;
  local_240 = 0;
  local_238 = this;
  QObject::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),KeyboardConfigTab::KeyboardConfigTab(PianoInput&,ShortcutTable&,QWidget*)::__1>
            (local_230,signal,(QObject *)QItemSelectionModel::selectionChanged,
             (anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_230);
  local_268 = QKeySequenceEdit::keySequenceChanged;
  local_260 = 0;
  local_258 = this;
  QObject::
  connect<void(QKeySequenceEdit::*)(QKeySequence_const&),KeyboardConfigTab::KeyboardConfigTab(PianoInput&,ShortcutTable&,QWidget*)::__2>
            (local_250,(offset_in_QKeySequenceEdit_to_subr)this->mKeyEdit,
             (QObject *)QKeySequenceEdit::keySequenceChanged,
             (anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_250);
  local_280 = QAbstractItemModel::dataChanged;
  local_278 = 0;
  local_290 = ConfigTab::setDirty<(Config::Category)4>;
  uStack_288 = 0;
  QObject::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(ConfigTab::*)()>
            (local_270,(offset_in_QAbstractItemModel_to_subr)this->mModel,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_270);
  pQVar4 = this->mLayoutCombo;
  context = (QObject *)
            QNonConstOverload<int>::operator()
                      ((QNonConstOverload<int> *)&qOverload<int>,
                       (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  QObject::
  connect<void(QComboBox::*)(int),KeyboardConfigTab::KeyboardConfigTab(PianoInput&,ShortcutTable&,QWidget*)::__3>
            (local_298,(offset_in_QComboBox_to_subr)pQVar4,context,slot,type);
  QMetaObject::Connection::~Connection((Connection *)local_298);
  setKeyEditEnable(this,false);
  return;
}

Assistant:

KeyboardConfigTab::KeyboardConfigTab(PianoInput &input, ShortcutTable &shortcuts, QWidget *parent) :
    ConfigTab(parent),
    mInput(input),
    mShortcuts(shortcuts),
    mSelectedShortcut(-1)
{

    auto layout = new QVBoxLayout;

    auto keyboardLayoutLayout = new QHBoxLayout;
    keyboardLayoutLayout->addWidget(new QLabel(tr("Layout:")));

    mLayoutCombo = new QComboBox;
    keyboardLayoutLayout->addWidget(mLayoutCombo, 1);

    mCustomGroup = new QGroupBox(tr("Custom layout"));
    auto customLayout = new QVBoxLayout;
    customLayout->addWidget(new QLabel(tr("Assign keys to each note. Press Shift+Del to unbind.")));
    mBindingEdit = new BindingEdit;
    customLayout->addWidget(mBindingEdit);
    mCustomGroup->setLayout(customLayout);

    auto shortcutGroup = new QGroupBox(tr("Shortcuts"));
    auto shortcutLayout = new QVBoxLayout;
    auto shortcutView = new QTreeView;
    mModel = new ShortcutTableModel(shortcuts, this);
    shortcutView->setModel(mModel);

    auto shortcutEditLayout = new QHBoxLayout;
    mKeyEdit = new QKeySequenceEdit;
    mClearButton = new QPushButton(tr("Clear"));
    mDefaultButton = new QPushButton(tr("Default"));
    shortcutEditLayout->addWidget(new QLabel(tr("Keys:")));
    shortcutEditLayout->addWidget(mKeyEdit, 1);
    shortcutEditLayout->addWidget(mClearButton);
    shortcutEditLayout->addWidget(mDefaultButton);

    shortcutLayout->addWidget(shortcutView, 1);
    shortcutLayout->addLayout(shortcutEditLayout);
    shortcutGroup->setLayout(shortcutLayout);

    layout->addLayout(keyboardLayoutLayout);
    layout->addWidget(mCustomGroup);
    layout->addWidget(shortcutGroup);
    layout->addStretch(1);
    setLayout(layout);

    // I'd like to have both columns 50/50 and user resizeable but
    // couldn't get it working so just do this for now
    shortcutView->resizeColumnToContents(0);

    for (int kblayout = PianoInput::LayoutQwerty; kblayout < PianoInput::LayoutCount; ++kblayout) {
        mLayoutCombo->addItem(PianoInput::layoutName((PianoInput::KeyboardLayout)kblayout));
    }
    mLayoutCombo->setCurrentIndex(input.layout());

    mCustomGroup->setEnabled(input.layout() == PianoInput::LayoutCustom);
    mBindingEdit->setBindings(input.bindings());

    lazyconnect(mBindingEdit, bindingsChanged, this, setDirty<Config::CategoryKeyboard>);

    lazyconnect(mClearButton, clicked, mKeyEdit, clear);
    connect(mDefaultButton, &QPushButton::clicked, this,
        [this]() {
            // sets the default shortcut for the current selection
            mKeyEdit->setKeySequence(ShortcutTable::getDefault((ShortcutTable::Shortcut)mSelectedShortcut));
        });

    connect(shortcutView->selectionModel(), &QItemSelectionModel::selectionChanged, this,
        [this](QItemSelection const& selected) {
            QSignalBlocker blocker(mKeyEdit); // ignore changed signals for the key edit

            bool hasSelection = !selected.isEmpty();
            setKeyEditEnable(hasSelection);
            if (hasSelection) {
                // get the row of the selection
                mSelectedShortcut = selected.indexes().first().row();
                // update the key edit with this row's key sequence
                mKeyEdit->setKeySequence(mShortcuts.get((ShortcutTable::Shortcut)mSelectedShortcut));
            } else {
                // no selection, clear the edit
                mSelectedShortcut = -1;
                mKeyEdit->clear();
            }
        });

    connect(mKeyEdit, &QKeySequenceEdit::keySequenceChanged, this,
        [this](QKeySequence const& seq) {
            // update the shortcut's sequence in the model
            mModel->setShortcut(mSelectedShortcut, seq);
        });

    // any change made to the model dirties the config
    lazyconnect(mModel, dataChanged, this, setDirty<Config::CategoryKeyboard>);

    connect(mLayoutCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index != -1) {
                setDirty<Config::CategoryKeyboard>();
                auto const layout = (PianoInput::KeyboardLayout)index;
                mInput.setLayout(layout);
                mBindingEdit->setBindings(mInput.bindings());
                mCustomGroup->setEnabled(layout == PianoInput::LayoutCustom);
            }
        });

    setKeyEditEnable(false);
}